

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

int AMPLSReportResults(AMPLS_MP_Solver *slv,char *solFileName)

{
  int iVar1;
  AMPLS_MP_Solver *in_RDI;
  anon_class_16_2_42ae1123 in_stack_00000000;
  
  iVar1 = AMPLS__internal__TryCatchWrapper<AMPLSReportResults::__0>(in_RDI,in_stack_00000000);
  return iVar1;
}

Assistant:

int AMPLSReportResults(AMPLS_MP_Solver* slv, const char* solFileName = NULL) {
  return AMPLS__internal__TryCatchWrapper( slv, [=]() {
    auto be = AMPLSGetBackend(slv);
    // If solFileName is NULL, we scrap any previous override
    be->OverrideSolutionFile(solFileName == NULL ? "" : solFileName);
    be->ReportResults();
  } );
}